

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O0

bool __thiscall App::jsonFile(App *this)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long in_RDI;
  string extn;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  byte local_81;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,".json",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  local_81 = 1;
  if (uVar2 < uVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,in_RDI + 8);
    local_81 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58
                                                ));
    std::__cxx11::string::~string(local_68);
  }
  local_1 = (local_81 & 1) == 0;
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool jsonFile() {
        std::string extn = ".json";
        if ( fileName.size() <= extn.size() ||
             fileName.substr(fileName.size()- extn.size()) != extn )
            return false;

        return true;
    }